

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    AssertHelperData::~AssertHelperData((AssertHelperData *)0x115af6);
    operator_delete(pvVar1,0x38);
  }
  return;
}

Assistant:

AssertHelper::~AssertHelper() {
  delete data_;
}